

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBvhTriangleMeshShape.cpp
# Opt level: O0

void __thiscall
btBvhTriangleMeshShape::btBvhTriangleMeshShape
          (btBvhTriangleMeshShape *this,btStridingMeshInterface *meshInterface,
          bool useQuantizedAabbCompression,btVector3 *bvhAabbMin,btVector3 *bvhAabbMax,bool buildBvh
          )

{
  void *ptr;
  btOptimizedBvh *this_00;
  byte in_DL;
  undefined8 *in_RDI;
  byte in_R9B;
  void *mem;
  btVector3 *in_stack_000000d0;
  btVector3 *in_stack_000000d8;
  bool in_stack_000000e7;
  btStridingMeshInterface *in_stack_000000e8;
  btOptimizedBvh *in_stack_000000f0;
  undefined8 in_stack_ffffffffffffff98;
  int alignment;
  size_t in_stack_ffffffffffffffa0;
  btStridingMeshInterface *in_stack_ffffffffffffffb8;
  btTriangleMeshShape *in_stack_ffffffffffffffc0;
  
  alignment = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  btTriangleMeshShape::btTriangleMeshShape(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *in_RDI = &PTR__btBvhTriangleMeshShape_002e3d38;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  *(byte *)(in_RDI + 0xb) = in_DL & 1;
  *(undefined1 *)((long)in_RDI + 0x59) = 0;
  *(undefined4 *)(in_RDI + 1) = 0x15;
  if ((in_R9B & 1) != 0) {
    ptr = btAlignedAllocInternal(in_stack_ffffffffffffffa0,alignment);
    this_00 = (btOptimizedBvh *)btOptimizedBvh::operator_new(0xf8,ptr);
    btOptimizedBvh::btOptimizedBvh(this_00);
    in_RDI[9] = this_00;
    btOptimizedBvh::build
              (in_stack_000000f0,in_stack_000000e8,in_stack_000000e7,in_stack_000000d8,
               in_stack_000000d0);
    *(undefined1 *)((long)in_RDI + 0x59) = 1;
  }
  return;
}

Assistant:

btBvhTriangleMeshShape::btBvhTriangleMeshShape(btStridingMeshInterface* meshInterface, bool useQuantizedAabbCompression,const btVector3& bvhAabbMin,const btVector3& bvhAabbMax,bool buildBvh)
:btTriangleMeshShape(meshInterface),
m_bvh(0),
m_triangleInfoMap(0),
m_useQuantizedAabbCompression(useQuantizedAabbCompression),
m_ownsBvh(false)
{
	m_shapeType = TRIANGLE_MESH_SHAPE_PROXYTYPE;
	//construct bvh from meshInterface
#ifndef DISABLE_BVH

	if (buildBvh)
	{
		void* mem = btAlignedAlloc(sizeof(btOptimizedBvh),16);
		m_bvh = new (mem) btOptimizedBvh();
		
		m_bvh->build(meshInterface,m_useQuantizedAabbCompression,bvhAabbMin,bvhAabbMax);
		m_ownsBvh = true;
	}

#endif //DISABLE_BVH

}